

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-cdf.c
# Opt level: O0

int coda_cdf_close(coda_product *product)

{
  coda_cdf_product *product_file;
  coda_product *product_local;
  
  if (product->filename != (char *)0x0) {
    free(product->filename);
  }
  if (product->root_type != (coda_dynamic_type *)0x0) {
    coda_dynamic_type_delete(product->root_type);
  }
  if (product->mem_ptr != (uint8_t *)0x0) {
    free(product->mem_ptr);
  }
  if (product[1].filename != (char *)0x0) {
    coda_bin_close((coda_product *)product[1].filename);
  }
  free(product);
  return 0;
}

Assistant:

int coda_cdf_close(coda_product *product)
{
    coda_cdf_product *product_file = (coda_cdf_product *)product;

    if (product_file->filename != NULL)
    {
        free(product_file->filename);
    }
    if (product_file->root_type != NULL)
    {
        coda_dynamic_type_delete((coda_dynamic_type *)product_file->root_type);
    }
    if (product_file->mem_ptr != NULL)
    {
        free(product_file->mem_ptr);
    }
    if (product_file->raw_product != NULL)
    {
        coda_bin_close((coda_product *)product_file->raw_product);
    }

    free(product_file);

    return 0;
}